

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O0

void __thiscall
MyServer::OnAdvertisement
          (MyServer *this,string *ipString,uint16_t port,uint8_t *data,uint32_t bytes)

{
  char *in_RCX;
  string *in_RSI;
  int in_R8D;
  uint8_t pong [1];
  LogStringBuffer buffer_1;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffff498;
  LogStringBuffer *in_stack_fffffffffffff4a0;
  undefined8 in_stack_fffffffffffff4a8;
  uint16_t port_00;
  string *in_stack_fffffffffffff4b0;
  SDKSocket *in_stack_fffffffffffff4b8;
  LogStringBuffer *in_stack_fffffffffffff4d8;
  Channel *pCVar1;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffff4e0;
  Channel *this_00;
  uint local_aac [4];
  ushort local_a9a [9];
  char *local_a88;
  uint *local_a80;
  char *local_a78;
  ushort *local_a70;
  char *local_a68;
  char *local_a58;
  Channel *local_a50;
  char *local_a48;
  uint *local_a40;
  char *local_a38;
  ushort *local_a30;
  char *local_a28;
  char *local_a18;
  Channel *local_a10;
  char *local_a08;
  uint *local_a00;
  char *local_9f8;
  ushort *local_9f0;
  char *local_9e8;
  char *local_9d8;
  undefined4 local_9cc;
  Channel *local_9c8;
  undefined4 local_9bc;
  Channel *local_9b8;
  char *local_9b0;
  uint *local_9a8;
  char *local_9a0;
  ushort *local_998;
  char *local_990;
  char *local_980;
  undefined4 local_974;
  Channel *local_970;
  undefined4 local_964;
  Channel *local_960;
  undefined1 local_948 [16];
  ostream aoStack_938 [376];
  char *local_7c0;
  uint *local_7b8;
  char *local_7b0;
  ushort *local_7a8;
  char *local_7a0;
  string *local_798;
  char *local_790;
  undefined4 local_784;
  Channel *local_780;
  undefined1 local_768 [16];
  ostream aoStack_758 [376];
  char *local_5e0;
  uint *local_5d8;
  char *local_5d0;
  ushort *local_5c8;
  char *local_5c0;
  string *local_5b8;
  char *local_5b0;
  undefined4 local_5a4;
  Channel *local_5a0;
  char *local_598;
  uint *local_590;
  char *local_588;
  ushort *local_580;
  char *local_578;
  string *local_570;
  char *local_568;
  undefined8 local_560;
  undefined1 *local_558;
  Channel *local_550;
  undefined8 local_548;
  undefined1 *local_540;
  Channel *local_538;
  undefined8 local_530;
  undefined1 *local_528;
  char *local_520;
  uint *local_518;
  char *local_510;
  ushort *local_508;
  char *local_500;
  string *local_4f8;
  char *local_4f0;
  undefined8 local_4e8;
  undefined1 *local_4e0;
  Channel *local_4d8;
  undefined8 local_4d0;
  undefined1 *local_4c8;
  Channel *local_4c0;
  undefined8 local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  uint *local_4a0;
  char *local_498;
  ushort *local_490;
  char *local_488;
  string *local_480;
  char *local_478;
  undefined1 *local_470;
  LogStringBuffer *local_468;
  char *local_460;
  uint *local_458;
  char *local_450;
  ushort *local_448;
  char *local_440;
  string *local_438;
  char *local_430;
  undefined1 *local_428;
  Channel *local_420;
  char *local_418;
  undefined1 *local_410;
  Channel *local_408;
  char *local_400;
  undefined1 *local_3f8;
  LogStringBuffer *local_3f0;
  char *local_3e8;
  uint *local_3e0;
  char *local_3d8;
  ushort *local_3d0;
  char *local_3c8;
  string *local_3c0;
  undefined1 *local_3b8;
  Channel *local_3b0;
  string *local_3a8;
  undefined1 *local_3a0;
  Channel *local_398;
  string *local_390;
  undefined1 *local_388;
  char *local_380;
  uint *local_378;
  char *local_370;
  ushort *local_368;
  char *local_360;
  string *local_358;
  undefined1 *local_350;
  LogStringBuffer *local_348;
  string *local_340;
  undefined1 *local_338;
  LogStringBuffer *local_330;
  string *local_328;
  undefined1 *local_320;
  char *local_318;
  undefined1 *local_310;
  char *local_308;
  undefined1 *local_300;
  char *local_2f8;
  uint *local_2f0;
  char *local_2e8;
  ushort *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  LogStringBuffer *local_2c8;
  char *local_2c0;
  uint *local_2b8;
  char *local_2b0;
  ushort *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  Channel *local_290;
  char *local_288;
  undefined1 *local_280;
  Channel *local_278;
  char *local_270;
  undefined1 *local_268;
  LogStringBuffer *local_260;
  char *local_258;
  uint *local_250;
  char *local_248;
  ushort *local_240;
  undefined1 *local_238;
  Channel *local_230;
  ushort *local_228;
  undefined1 *local_220;
  Channel *local_218;
  ushort *local_210;
  undefined1 *local_208;
  char *local_200;
  uint *local_1f8;
  char *local_1f0;
  ushort *local_1e8;
  undefined1 *local_1e0;
  LogStringBuffer *local_1d8;
  ushort *local_1d0;
  undefined1 *local_1c8;
  LogStringBuffer *local_1c0;
  ushort *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  undefined1 *local_190;
  char *local_188;
  uint *local_180;
  char *local_178;
  undefined1 *local_170;
  LogStringBuffer *local_168;
  char *local_160;
  undefined1 *local_158;
  LogStringBuffer *local_150;
  char *local_148;
  undefined1 *local_140;
  char *local_138;
  uint *local_130;
  char *local_128;
  undefined1 *local_120;
  Channel *local_118;
  char *local_110;
  undefined1 *local_108;
  Channel *local_100;
  char *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  uint *local_e0;
  undefined1 *local_d8;
  Channel *local_d0;
  char *local_c8;
  uint *local_c0;
  undefined1 *local_b8;
  LogStringBuffer *local_b0;
  uint *local_a8;
  undefined1 *local_a0;
  LogStringBuffer *local_98;
  uint *local_90;
  undefined1 *local_88;
  Channel *local_80;
  char *local_78;
  undefined1 *local_70;
  LogStringBuffer *local_68;
  char *local_60;
  undefined1 *local_58;
  Channel *local_50;
  uint *local_48;
  undefined1 *local_40;
  uint *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  port_00 = (uint16_t)((ulong)in_stack_fffffffffffff4a8 >> 0x30);
  if (in_R8D == 1) {
    if (*in_RCX == 'd') {
      local_a10 = &Logger;
      local_a18 = "Advertisement PING received from ";
      local_a28 = ":";
      local_a30 = local_a9a;
      local_a38 = " - ";
      local_a40 = local_aac;
      local_a48 = " bytes";
      local_9c8 = &Logger;
      local_9cc = 2;
      local_9d8 = "Advertisement PING received from ";
      local_9e8 = ":";
      local_9f8 = " - ";
      local_a08 = " bytes";
      local_9b8 = &Logger;
      local_9bc = 2;
      local_a00 = local_a40;
      local_9f0 = local_a30;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_5a0 = &Logger;
        local_5a4 = 2;
        local_5b0 = "Advertisement PING received from ";
        local_5c0 = ":";
        local_5d0 = " - ";
        local_5e0 = " bytes";
        local_5d8 = local_a40;
        local_5c8 = local_a30;
        local_5b8 = in_RSI;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,Trace);
        local_560 = 0x116318;
        local_550 = &Logger;
        local_568 = local_5b0;
        local_570 = local_5b8;
        local_578 = local_5c0;
        local_580 = local_5c8;
        local_588 = local_5d0;
        local_590 = local_5d8;
        local_598 = local_5e0;
        local_538 = &Logger;
        local_558 = local_768;
        local_548 = local_560;
        local_540 = local_768;
        local_530 = local_560;
        local_528 = local_768;
        std::operator<<(aoStack_758,(string *)&Logger.Prefix);
        local_420 = &Logger;
        local_428 = local_558;
        local_430 = local_568;
        local_438 = local_570;
        local_440 = local_578;
        local_448 = local_580;
        local_450 = local_588;
        local_458 = local_590;
        local_460 = local_598;
        local_408 = &Logger;
        local_410 = local_558;
        local_418 = local_568;
        local_300 = local_558;
        local_308 = local_568;
        std::operator<<((ostream *)(local_558 + 0x10),local_568);
        local_3b0 = &Logger;
        local_3b8 = local_428;
        local_3c0 = local_438;
        local_3c8 = local_440;
        local_3d0 = local_448;
        local_3d8 = local_450;
        local_3e0 = local_458;
        local_3e8 = local_460;
        local_398 = &Logger;
        local_3a0 = local_428;
        local_3a8 = local_438;
        local_388 = local_428;
        local_390 = local_438;
        std::operator<<((ostream *)(local_428 + 0x10),local_438);
        local_290 = &Logger;
        local_298 = local_3b8;
        local_2a0 = local_3c8;
        local_2a8 = local_3d0;
        local_2b0 = local_3d8;
        local_2b8 = local_3e0;
        local_2c0 = local_3e8;
        local_278 = &Logger;
        local_280 = local_3b8;
        local_288 = local_3c8;
        local_190 = local_3b8;
        local_198 = local_3c8;
        std::operator<<((ostream *)(local_3b8 + 0x10),local_3c8);
        local_230 = &Logger;
        local_238 = local_298;
        local_240 = local_2a8;
        local_248 = local_2b0;
        local_250 = local_2b8;
        local_258 = local_2c0;
        local_218 = &Logger;
        local_220 = local_298;
        local_228 = local_2a8;
        local_208 = local_298;
        local_210 = local_2a8;
        std::ostream::operator<<((ostream *)(local_298 + 0x10),*local_2a8);
        local_118 = &Logger;
        local_120 = local_238;
        local_128 = local_248;
        local_130 = local_250;
        local_138 = local_258;
        local_100 = &Logger;
        local_108 = local_238;
        local_110 = local_248;
        local_f0 = local_238;
        local_f8 = local_248;
        std::operator<<((ostream *)(local_238 + 0x10),local_248);
        local_d0 = &Logger;
        local_d8 = local_120;
        local_e0 = local_130;
        local_e8 = local_138;
        local_80 = &Logger;
        local_88 = local_120;
        local_90 = local_130;
        local_40 = local_120;
        local_48 = local_130;
        std::ostream::operator<<((ostream *)(local_120 + 0x10),*local_130);
        local_50 = &Logger;
        local_58 = local_d8;
        local_60 = local_e8;
        local_20 = local_d8;
        local_28 = local_e8;
        std::operator<<((ostream *)(local_d8 + 0x10),local_e8);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x106fe3);
      }
      tonk::SDKSocket::Advertise
                (in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,port_00,
                 in_stack_fffffffffffff4a0,(uint32_t)((ulong)in_stack_fffffffffffff498 >> 0x20));
    }
    else if (*in_RCX == -0x38) {
      local_a50 = &Logger;
      local_a58 = "Advertisement PONG received from ";
      local_a68 = ":";
      local_a70 = local_a9a;
      local_a78 = " - ";
      local_a80 = local_aac;
      local_a88 = " bytes";
      local_970 = &Logger;
      local_974 = 2;
      local_980 = "Advertisement PONG received from ";
      local_990 = ":";
      local_9a0 = " - ";
      local_9b0 = " bytes";
      this_00 = &Logger;
      local_960 = &Logger;
      local_964 = 2;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_780 = &Logger;
        local_784 = 2;
        local_790 = "Advertisement PONG received from ";
        local_7a0 = ":";
        local_7b0 = " - ";
        local_7c0 = " bytes";
        local_9a8 = local_a80;
        local_998 = local_a70;
        local_7b8 = local_a80;
        local_7a8 = local_a70;
        local_798 = in_RSI;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,Trace);
        local_4e8 = 0x116318;
        local_4d8 = &Logger;
        local_4f0 = local_790;
        local_4f8 = local_798;
        local_500 = local_7a0;
        local_508 = local_7a8;
        local_510 = local_7b0;
        local_518 = local_7b8;
        local_520 = local_7c0;
        pCVar1 = &Logger;
        local_4c0 = &Logger;
        local_4e0 = local_948;
        local_4d0 = local_4e8;
        local_4c8 = local_948;
        local_4b8 = local_4e8;
        local_4b0 = local_948;
        std::operator<<(aoStack_938,(string *)&Logger.Prefix);
        local_470 = local_4e0;
        local_478 = local_4f0;
        local_480 = local_4f8;
        local_488 = local_500;
        local_490 = local_508;
        local_498 = local_510;
        local_4a0 = local_518;
        local_4a8 = local_520;
        local_3f8 = local_4e0;
        local_400 = local_4f0;
        local_310 = local_4e0;
        local_318 = local_4f0;
        buffer_00 = (LogStringBuffer *)pCVar1;
        local_468 = (LogStringBuffer *)pCVar1;
        local_3f0 = (LogStringBuffer *)pCVar1;
        std::operator<<((ostream *)(local_4e0 + 0x10),local_4f0);
        local_350 = local_470;
        local_358 = local_480;
        local_360 = local_488;
        local_368 = local_490;
        local_370 = local_498;
        local_378 = local_4a0;
        local_380 = local_4a8;
        local_338 = local_470;
        local_340 = local_480;
        local_320 = local_470;
        local_328 = local_480;
        local_348 = (LogStringBuffer *)pCVar1;
        local_330 = (LogStringBuffer *)pCVar1;
        std::operator<<((ostream *)(local_470 + 0x10),local_480);
        local_2d0 = local_350;
        local_2d8 = local_360;
        local_2e0 = local_368;
        local_2e8 = local_370;
        local_2f0 = local_378;
        local_2f8 = local_380;
        local_268 = local_350;
        local_270 = local_360;
        local_1a0 = local_350;
        local_1a8 = local_360;
        local_2c8 = (LogStringBuffer *)pCVar1;
        local_260 = (LogStringBuffer *)pCVar1;
        std::operator<<((ostream *)(local_350 + 0x10),local_360);
        local_1e0 = local_2d0;
        local_1e8 = local_2e0;
        local_1f0 = local_2e8;
        local_1f8 = local_2f0;
        local_200 = local_2f8;
        local_1c8 = local_2d0;
        local_1d0 = local_2e0;
        local_1b0 = local_2d0;
        local_1b8 = local_2e0;
        local_1d8 = (LogStringBuffer *)pCVar1;
        local_1c0 = (LogStringBuffer *)pCVar1;
        std::ostream::operator<<((ostream *)(local_2d0 + 0x10),*local_2e0);
        local_170 = local_1e0;
        local_178 = local_1f0;
        local_180 = local_1f8;
        local_188 = local_200;
        local_158 = local_1e0;
        local_160 = local_1f0;
        local_140 = local_1e0;
        local_148 = local_1f0;
        local_168 = (LogStringBuffer *)pCVar1;
        local_150 = (LogStringBuffer *)pCVar1;
        std::operator<<((ostream *)(local_1e0 + 0x10),local_1f0);
        local_b8 = local_170;
        local_c0 = local_180;
        local_c8 = local_188;
        local_a0 = local_170;
        local_a8 = local_180;
        local_30 = local_170;
        local_38 = local_180;
        local_b0 = (LogStringBuffer *)pCVar1;
        local_98 = (LogStringBuffer *)pCVar1;
        std::ostream::operator<<((ostream *)(local_170 + 0x10),*local_180);
        local_70 = local_b8;
        local_78 = local_c8;
        local_10 = local_b8;
        local_18 = local_c8;
        local_68 = (LogStringBuffer *)pCVar1;
        std::operator<<((ostream *)(local_b8 + 0x10),local_c8);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10791a);
      }
    }
  }
  return;
}

Assistant:

void MyServer::OnAdvertisement(
    const std::string& ipString, ///< Source IP address of advertisement
    uint16_t               port, ///< Source port address of advertisement
    const uint8_t*         data,  ///< Pointer to a buffer containing the message data
    uint32_t              bytes)  ///< Number of bytes in the message
{
    if (bytes != 1) {
        return;
    }

    if (data[0] == 100)
    {
        Logger.Info("Advertisement PING received from ", ipString, ":", port, " - ", bytes, " bytes");

        uint8_t pong[1] = {
            200
        };
        Advertise(ipString, port, pong, 1);
        return;
    }

    if (data[0] == 200)
    {
        Logger.Info("Advertisement PONG received from ", ipString, ":", port, " - ", bytes, " bytes");
        return;
    }
}